

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O3

Display * sf::priv::OpenDisplay(void)

{
  Display *pDVar1;
  ostream *poVar2;
  Lock lock;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::mutex);
  if (((anonymous_namespace)::referenceCount == 0) &&
     ((anonymous_namespace)::sharedDisplay = (Display *)XOpenDisplay(0),
     (anonymous_namespace)::sharedDisplay == (Display *)0x0)) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "Failed to open X11 display; make sure the DISPLAY environment variable is set correctly"
               ,0x57);
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  pDVar1 = (anonymous_namespace)::sharedDisplay;
  (anonymous_namespace)::referenceCount = (anonymous_namespace)::referenceCount + 1;
  Lock::~Lock(&local_10);
  return pDVar1;
}

Assistant:

Display* OpenDisplay()
{
    Lock lock(mutex);

    if (referenceCount == 0)
    {
        sharedDisplay = XOpenDisplay(NULL);

        // Opening display failed: The best we can do at the moment is to output a meaningful error message
        // and cause an abnormal program termination
        if (!sharedDisplay)
        {
            err() << "Failed to open X11 display; make sure the DISPLAY environment variable is set correctly" << std::endl;
            std::abort();
        }
    }

    referenceCount++;
    return sharedDisplay;
}